

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizepolicy.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QSizePolicy *p)

{
  QDebug *pQVar1;
  QSizePolicy *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QDebug *in_stack_ffffffffffffff98;
  QDebug *this;
  Stream *pSVar2;
  Policy value;
  Stream *t;
  QDebug local_30;
  QDebug local_28;
  QDebug local_20;
  QDebug local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  pSVar2 = in_RDI;
  t = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,(QDebug *)in_RSI);
  value = (Policy)((ulong)pSVar2 >> 0x20);
  QDebug::nospace(in_RSI);
  pQVar1 = QDebug::operator<<(in_stack_ffffffffffffff98,(char *)t);
  this = &local_30;
  QDebug::QDebug(this,pQVar1);
  QSizePolicy::horizontalPolicy(in_RDX);
  operator<<(in_RSI,value);
  pQVar1 = QDebug::operator<<(this,(char *)t);
  QDebug::QDebug(&local_20,pQVar1);
  QSizePolicy::verticalPolicy(in_RDX);
  pQVar1 = &local_18;
  operator<<(in_RSI,value);
  QDebug::operator<<(pQVar1,(char)((ulong)in_RDI >> 0x38));
  QDebug::~QDebug(pQVar1);
  QDebug::~QDebug(&local_20);
  QDebug::~QDebug(&local_28);
  QDebug::~QDebug(this);
  QDebug::QDebug(pQVar1,(QDebug *)in_RDI);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QSizePolicy &p)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QSizePolicy(horizontalPolicy = " << p.horizontalPolicy()
                  << ", verticalPolicy = " << p.verticalPolicy() << ')';
    return dbg;
}